

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::XmlReporter(XmlReporter *this,ReporterConfig *config)

{
  ReporterConfig *config_local;
  XmlReporter *this_local;
  
  SharedImpl<Catch::IReporter>::SharedImpl(&this->super_SharedImpl<Catch::IReporter>);
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__XmlReporter_002babc0;
  ReporterConfig::ReporterConfig(&this->m_config,config);
  XmlWriter::XmlWriter(&this->m_xml);
  return;
}

Assistant:

XmlReporter( const ReporterConfig& config ) : m_config( config ) {}